

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O0

string_t duckdb::UhugeintToStringCast::Format(uhugeint_t value,Vector *vector)

{
  char *__dest;
  string_t *this;
  size_t __n;
  char *data;
  string str;
  string_t result;
  idx_t in_stack_ffffffffffffff58;
  Vector *in_stack_ffffffffffffff60;
  uhugeint_t *in_stack_ffffffffffffff68;
  string asStack_48 [56];
  anon_union_16_2_67f50693_for_value aStack_10;
  
  uhugeint_t::ToString(in_stack_ffffffffffffff68);
  ::std::__cxx11::string::length();
  aStack_10.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  __dest = string_t::GetDataWriteable((string_t *)in_stack_ffffffffffffff60);
  this = (string_t *)::std::__cxx11::string::data();
  __n = ::std::__cxx11::string::length();
  memcpy(__dest,this,__n);
  string_t::Finalize(this);
  ::std::__cxx11::string::~string(asStack_48);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aStack_10.pointer;
}

Assistant:

static string_t Format(uhugeint_t value, Vector &vector) {
		std::string str = value.ToString();
		string_t result = StringVector::EmptyString(vector, str.length());
		auto data = result.GetDataWriteable();

		memcpy(data, str.data(), str.length()); // NOLINT: null-termination not required
		result.Finalize();
		return result;
	}